

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolutionNeighbourhood.cpp
# Opt level: O0

void __thiscall
SolutionNeighbourhood::SolutionNeighbourhood(SolutionNeighbourhood *this,Solution *solution)

{
  bool bVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar2;
  pointer ppVar3;
  _Self local_38 [3];
  _Self local_20;
  const_iterator it;
  Solution *solution_local;
  SolutionNeighbourhood *this_local;
  
  this->solution = solution;
  this->lastMove = (Move *)0x0;
  it._M_node = (_Base_ptr)solution;
  std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::vector(&this->nurseVector);
  this->ended = false;
  this->phase = 0;
  this->iterator1 = 0;
  this->iterator2 = 0;
  this->iteratorTurn1 = 0;
  this->iteratorTurn2 = 0;
  pmVar2 = Solution::getNurses_abi_cxx11_((Solution *)it._M_node);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
       ::begin(pmVar2);
  while( true ) {
    pmVar2 = Solution::getNurses_abi_cxx11_((Solution *)it._M_node);
    local_38[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
         ::end(pmVar2);
    bVar1 = std::operator!=(&local_20,local_38);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>
             ::operator->(&local_20);
    std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::push_back
              (&this->nurseVector,&ppVar3->second);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

SolutionNeighbourhood::SolutionNeighbourhood(Solution* solution) : solution(solution){
    this->phase = 0;
    this->iterator1 = 0;
    this->iterator2 = 0;
    this->iteratorTurn1 = 0;
    this->iteratorTurn2 = 0;

    for(auto it = solution->getNurses().begin(); it != solution->getNurses().end(); ++it ) {
        this->nurseVector.push_back( it->second );
    }
}